

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O0

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateCompanionObject
          (KotlinKMPGenerator *this,CodeWriter *code,function<void_()> *callback)

{
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  function<void_()> *local_20;
  function<void_()> *callback_local;
  CodeWriter *code_local;
  KotlinKMPGenerator *this_local;
  
  local_20 = callback;
  callback_local = (function<void_()> *)code;
  code_local = (CodeWriter *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"companion object {",&local_41);
  CodeWriter::operator+=((CodeWriter *)callback_local,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  CodeWriter::IncrementIdentLevel((CodeWriter *)callback_local);
  std::function<void_()>::operator()(local_20);
  CodeWriter::DecrementIdentLevel((CodeWriter *)callback_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"}",&local_79);
  CodeWriter::operator+=((CodeWriter *)callback_local,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  return;
}

Assistant:

void GenerateCompanionObject(CodeWriter &code,
                               const std::function<void()> &callback) const {
    code += "companion object {";
    code.IncrementIdentLevel();
    callback();
    code.DecrementIdentLevel();
    code += "}";
  }